

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_1x1_pack8.h
# Opt level: O2

void ncnn::conv1x1s1_sgemm_transform_kernel_pack8_avx
               (Mat *kernel,Mat *weight_data_pack8,int num_input,int num_output)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  undefined4 *puVar7;
  undefined4 *puVar8;
  undefined4 *puVar9;
  undefined4 *puVar10;
  long lVar11;
  long lVar12;
  undefined4 *puVar13;
  undefined4 *puVar14;
  undefined4 *puVar15;
  ulong uVar16;
  undefined4 *puVar17;
  uint _c;
  long lVar18;
  undefined4 *puVar19;
  Mat k7;
  Mat k6;
  Mat k5;
  Mat k4;
  Mat k3;
  Mat k2;
  Mat k1;
  Mat k0;
  Mat g0;
  Mat weight_data_r2;
  
  uVar16 = 0;
  Mat::reshape(&weight_data_r2,kernel,1,num_input,num_output,(Allocator *)0x0);
  Mat::create(weight_data_pack8,1,num_input / 8,num_output / 8,0x100,0x40,(Allocator *)0x0);
  while( true ) {
    _c = (uint)uVar16;
    if (num_output <= (int)(_c | 7)) break;
    Mat::channel(&k0,&weight_data_r2,_c);
    Mat::channel(&k1,&weight_data_r2,_c | 1);
    Mat::channel(&k2,&weight_data_r2,_c | 2);
    Mat::channel(&k3,&weight_data_r2,_c | 3);
    Mat::channel(&k4,&weight_data_r2,_c | 4);
    Mat::channel(&k5,&weight_data_r2,_c | 5);
    Mat::channel(&k6,&weight_data_r2,_c | 6);
    Mat::channel(&k7,&weight_data_r2,_c | 7);
    Mat::channel(&g0,weight_data_pack8,(int)(uVar16 >> 3));
    lVar11 = (long)k0.w * k0.elemsize;
    lVar1 = (long)k1.w * k1.elemsize;
    lVar2 = (long)k2.w * k2.elemsize;
    lVar3 = (long)k3.w * k3.elemsize;
    lVar4 = (long)k4.w * k4.elemsize;
    lVar5 = (long)k5.w * k5.elemsize;
    lVar6 = (long)k6.w * k6.elemsize;
    lVar18 = (long)k7.w * k7.elemsize;
    puVar17 = (undefined4 *)((long)g0.data + 0xfc);
    puVar7 = (undefined4 *)k6.data;
    puVar8 = (undefined4 *)k7.data;
    puVar9 = (undefined4 *)k0.data;
    puVar10 = (undefined4 *)k4.data;
    puVar13 = (undefined4 *)k1.data;
    puVar14 = (undefined4 *)k2.data;
    puVar15 = (undefined4 *)k3.data;
    puVar19 = (undefined4 *)k5.data;
    for (lVar12 = 7; lVar12 < num_input; lVar12 = lVar12 + 8) {
      puVar17[-0x3f] = *puVar9;
      puVar17[-0x3e] = *puVar13;
      puVar17[-0x3d] = *puVar14;
      puVar17[-0x3c] = *puVar15;
      puVar17[-0x3b] = *puVar10;
      puVar17[-0x3a] = *puVar19;
      puVar17[-0x39] = *puVar7;
      puVar17[-0x38] = *puVar8;
      puVar17[-0x37] = *(undefined4 *)((long)puVar9 + lVar11);
      puVar17[-0x36] = *(undefined4 *)((long)puVar13 + lVar1);
      puVar17[-0x35] = *(undefined4 *)((long)puVar14 + lVar2);
      puVar17[-0x34] = *(undefined4 *)((long)puVar15 + lVar3);
      puVar17[-0x33] = *(undefined4 *)((long)puVar10 + lVar4);
      puVar17[-0x32] = *(undefined4 *)((long)puVar19 + lVar5);
      puVar17[-0x31] = *(undefined4 *)((long)puVar7 + lVar6);
      puVar17[-0x30] = *(undefined4 *)((long)puVar8 + lVar18);
      puVar17[-0x2f] = *(undefined4 *)((long)puVar9 + lVar11 * 2);
      puVar17[-0x2e] = *(undefined4 *)((long)puVar13 + lVar1 * 2);
      puVar17[-0x2d] = *(undefined4 *)((long)puVar14 + lVar2 * 2);
      puVar17[-0x2c] = *(undefined4 *)((long)puVar15 + lVar3 * 2);
      puVar17[-0x2b] = *(undefined4 *)((long)puVar10 + lVar4 * 2);
      puVar17[-0x2a] = *(undefined4 *)((long)puVar19 + lVar5 * 2);
      puVar17[-0x29] = *(undefined4 *)((long)puVar7 + lVar6 * 2);
      puVar17[-0x28] = *(undefined4 *)((long)puVar8 + lVar18 * 2);
      puVar17[-0x27] = *(undefined4 *)((long)puVar9 + lVar11 * 3);
      puVar17[-0x26] = *(undefined4 *)((long)puVar13 + lVar1 * 3);
      puVar17[-0x25] = *(undefined4 *)((long)puVar14 + lVar2 * 3);
      puVar17[-0x24] = *(undefined4 *)((long)puVar15 + lVar3 * 3);
      puVar17[-0x23] = *(undefined4 *)((long)puVar10 + lVar4 * 3);
      puVar17[-0x22] = *(undefined4 *)((long)puVar19 + lVar5 * 3);
      puVar17[-0x21] = *(undefined4 *)((long)puVar7 + lVar6 * 3);
      puVar17[-0x20] = *(undefined4 *)((long)puVar8 + lVar18 * 3);
      puVar17[-0x1f] = puVar9[lVar11];
      puVar17[-0x1e] = puVar13[lVar1];
      puVar17[-0x1d] = puVar14[lVar2];
      puVar17[-0x1c] = puVar15[lVar3];
      puVar17[-0x1b] = puVar10[lVar4];
      puVar17[-0x1a] = puVar19[lVar5];
      puVar17[-0x19] = puVar7[lVar6];
      puVar17[-0x18] = puVar8[lVar18];
      puVar17[-0x17] = *(undefined4 *)((long)puVar9 + lVar11 * 5);
      puVar17[-0x16] = *(undefined4 *)((long)puVar13 + lVar1 * 5);
      puVar17[-0x15] = *(undefined4 *)((long)puVar14 + lVar2 * 5);
      puVar17[-0x14] = *(undefined4 *)((long)puVar15 + lVar3 * 5);
      puVar17[-0x13] = *(undefined4 *)((long)puVar10 + lVar4 * 5);
      puVar17[-0x12] = *(undefined4 *)((long)puVar19 + lVar5 * 5);
      puVar17[-0x11] = *(undefined4 *)((long)puVar7 + lVar6 * 5);
      puVar17[-0x10] = *(undefined4 *)((long)puVar8 + lVar18 * 5);
      puVar17[-0xf] = *(undefined4 *)((long)puVar9 + lVar11 * 6);
      puVar17[-0xe] = *(undefined4 *)((long)puVar13 + lVar1 * 6);
      puVar17[-0xd] = *(undefined4 *)((long)puVar14 + lVar2 * 6);
      puVar17[-0xc] = *(undefined4 *)((long)puVar15 + lVar3 * 6);
      puVar17[-0xb] = *(undefined4 *)((long)puVar10 + lVar4 * 6);
      puVar17[-10] = *(undefined4 *)((long)puVar19 + lVar5 * 6);
      puVar17[-9] = *(undefined4 *)((long)puVar7 + lVar6 * 6);
      puVar17[-8] = *(undefined4 *)((long)puVar8 + lVar18 * 6);
      puVar17[-7] = *(undefined4 *)((long)puVar9 + lVar11 * 7);
      puVar17[-6] = *(undefined4 *)((long)puVar13 + lVar1 * 7);
      puVar17[-5] = *(undefined4 *)((long)puVar14 + lVar2 * 7);
      puVar17[-4] = *(undefined4 *)((long)puVar15 + lVar3 * 7);
      puVar17[-3] = *(undefined4 *)((long)puVar10 + lVar4 * 7);
      puVar17[-2] = *(undefined4 *)((long)puVar19 + lVar5 * 7);
      puVar17[-1] = *(undefined4 *)((long)puVar7 + lVar6 * 7);
      *puVar17 = *(undefined4 *)((long)puVar8 + lVar18 * 7);
      puVar9 = puVar9 + lVar11 * 2;
      puVar13 = puVar13 + lVar1 * 2;
      puVar14 = puVar14 + lVar2 * 2;
      puVar15 = puVar15 + lVar3 * 2;
      puVar10 = puVar10 + lVar4 * 2;
      puVar19 = puVar19 + lVar5 * 2;
      puVar7 = puVar7 + lVar6 * 2;
      puVar8 = puVar8 + lVar18 * 2;
      puVar17 = (undefined4 *)((long)puVar17 + (long)g0.w * g0.elemsize);
    }
    Mat::~Mat(&g0);
    Mat::~Mat(&k7);
    Mat::~Mat(&k6);
    Mat::~Mat(&k5);
    Mat::~Mat(&k4);
    Mat::~Mat(&k3);
    Mat::~Mat(&k2);
    Mat::~Mat(&k1);
    Mat::~Mat(&k0);
    uVar16 = (ulong)(_c + 8);
  }
  Mat::~Mat(&weight_data_r2);
  return;
}

Assistant:

static void conv1x1s1_sgemm_transform_kernel_pack8_avx(const Mat& kernel, Mat& weight_data_pack8, int num_input, int num_output)
{
    // src = kw-kh-inch-outch
    // dst = 8b-8a-kw-kh-inch/8a-outch/8b
    Mat weight_data_r2 = kernel.reshape(1, num_input, num_output);

    weight_data_pack8.create(1, num_input / 8, num_output / 8, (size_t)4 * 64, 64);

    for (int q = 0; q + 7 < num_output; q += 8)
    {
        const Mat k0 = weight_data_r2.channel(q);
        const Mat k1 = weight_data_r2.channel(q + 1);
        const Mat k2 = weight_data_r2.channel(q + 2);
        const Mat k3 = weight_data_r2.channel(q + 3);
        const Mat k4 = weight_data_r2.channel(q + 4);
        const Mat k5 = weight_data_r2.channel(q + 5);
        const Mat k6 = weight_data_r2.channel(q + 6);
        const Mat k7 = weight_data_r2.channel(q + 7);

        Mat g0 = weight_data_pack8.channel(q / 8);

        for (int p = 0; p + 7 < num_input; p += 8)
        {
            const float* k00 = k0.row(p);
            const float* k01 = k0.row(p + 1);
            const float* k02 = k0.row(p + 2);
            const float* k03 = k0.row(p + 3);
            const float* k04 = k0.row(p + 4);
            const float* k05 = k0.row(p + 5);
            const float* k06 = k0.row(p + 6);
            const float* k07 = k0.row(p + 7);

            const float* k10 = k1.row(p);
            const float* k11 = k1.row(p + 1);
            const float* k12 = k1.row(p + 2);
            const float* k13 = k1.row(p + 3);
            const float* k14 = k1.row(p + 4);
            const float* k15 = k1.row(p + 5);
            const float* k16 = k1.row(p + 6);
            const float* k17 = k1.row(p + 7);

            const float* k20 = k2.row(p);
            const float* k21 = k2.row(p + 1);
            const float* k22 = k2.row(p + 2);
            const float* k23 = k2.row(p + 3);
            const float* k24 = k2.row(p + 4);
            const float* k25 = k2.row(p + 5);
            const float* k26 = k2.row(p + 6);
            const float* k27 = k2.row(p + 7);

            const float* k30 = k3.row(p);
            const float* k31 = k3.row(p + 1);
            const float* k32 = k3.row(p + 2);
            const float* k33 = k3.row(p + 3);
            const float* k34 = k3.row(p + 4);
            const float* k35 = k3.row(p + 5);
            const float* k36 = k3.row(p + 6);
            const float* k37 = k3.row(p + 7);

            const float* k40 = k4.row(p);
            const float* k41 = k4.row(p + 1);
            const float* k42 = k4.row(p + 2);
            const float* k43 = k4.row(p + 3);
            const float* k44 = k4.row(p + 4);
            const float* k45 = k4.row(p + 5);
            const float* k46 = k4.row(p + 6);
            const float* k47 = k4.row(p + 7);

            const float* k50 = k5.row(p);
            const float* k51 = k5.row(p + 1);
            const float* k52 = k5.row(p + 2);
            const float* k53 = k5.row(p + 3);
            const float* k54 = k5.row(p + 4);
            const float* k55 = k5.row(p + 5);
            const float* k56 = k5.row(p + 6);
            const float* k57 = k5.row(p + 7);

            const float* k60 = k6.row(p);
            const float* k61 = k6.row(p + 1);
            const float* k62 = k6.row(p + 2);
            const float* k63 = k6.row(p + 3);
            const float* k64 = k6.row(p + 4);
            const float* k65 = k6.row(p + 5);
            const float* k66 = k6.row(p + 6);
            const float* k67 = k6.row(p + 7);

            const float* k70 = k7.row(p);
            const float* k71 = k7.row(p + 1);
            const float* k72 = k7.row(p + 2);
            const float* k73 = k7.row(p + 3);
            const float* k74 = k7.row(p + 4);
            const float* k75 = k7.row(p + 5);
            const float* k76 = k7.row(p + 6);
            const float* k77 = k7.row(p + 7);

            float* g00 = g0.row(p / 8);
            g00[0] = k00[0];
            g00[1] = k10[0];
            g00[2] = k20[0];
            g00[3] = k30[0];
            g00[4] = k40[0];
            g00[5] = k50[0];
            g00[6] = k60[0];
            g00[7] = k70[0];
            g00 += 8;
            g00[0] = k01[0];
            g00[1] = k11[0];
            g00[2] = k21[0];
            g00[3] = k31[0];
            g00[4] = k41[0];
            g00[5] = k51[0];
            g00[6] = k61[0];
            g00[7] = k71[0];

            g00 += 8;
            g00[0] = k02[0];
            g00[1] = k12[0];
            g00[2] = k22[0];
            g00[3] = k32[0];
            g00[4] = k42[0];
            g00[5] = k52[0];
            g00[6] = k62[0];
            g00[7] = k72[0];

            g00 += 8;
            g00[0] = k03[0];
            g00[1] = k13[0];
            g00[2] = k23[0];
            g00[3] = k33[0];
            g00[4] = k43[0];
            g00[5] = k53[0];
            g00[6] = k63[0];
            g00[7] = k73[0];

            g00 += 8;
            g00[0] = k04[0];
            g00[1] = k14[0];
            g00[2] = k24[0];
            g00[3] = k34[0];
            g00[4] = k44[0];
            g00[5] = k54[0];
            g00[6] = k64[0];
            g00[7] = k74[0];

            g00 += 8;
            g00[0] = k05[0];
            g00[1] = k15[0];
            g00[2] = k25[0];
            g00[3] = k35[0];
            g00[4] = k45[0];
            g00[5] = k55[0];
            g00[6] = k65[0];
            g00[7] = k75[0];

            g00 += 8;
            g00[0] = k06[0];
            g00[1] = k16[0];
            g00[2] = k26[0];
            g00[3] = k36[0];
            g00[4] = k46[0];
            g00[5] = k56[0];
            g00[6] = k66[0];
            g00[7] = k76[0];

            g00 += 8;
            g00[0] = k07[0];
            g00[1] = k17[0];
            g00[2] = k27[0];
            g00[3] = k37[0];
            g00[4] = k47[0];
            g00[5] = k57[0];
            g00[6] = k67[0];
            g00[7] = k77[0];

            g00 += 8;
        }
    }
}